

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O1

RegexMatcher * __thiscall
icu_63::RegexMatcher::reset(RegexMatcher *this,int64_t position,UErrorCode *status)

{
  long lVar1;
  
  if (U_ZERO_ERROR < *status) {
    return this;
  }
  this->fRegionStart = 0;
  lVar1 = this->fInputLength;
  this->fRegionLimit = lVar1;
  this->fActiveStart = 0;
  this->fActiveLimit = lVar1;
  this->fAnchorStart = 0;
  this->fAnchorLimit = lVar1;
  this->fLookStart = 0;
  this->fLookLimit = lVar1;
  this->fMatchStart = 0;
  this->fMatchEnd = 0;
  this->fLastMatchEnd = -1;
  this->fAppendPosition = 0;
  this->fMatch = '\0';
  this->fHitEnd = '\0';
  this->fRequireEnd = '\0';
  this->fTime = 0;
  this->fTickCounter = 10000;
  if (lVar1 < position || position < 0) {
    *status = U_INDEX_OUTOFBOUNDS_ERROR;
    return this;
  }
  this->fMatchEnd = position;
  return this;
}

Assistant:

RegexMatcher &RegexMatcher::reset(int64_t position, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return *this;
    }
    reset();       // Reset also resets the region to be the entire string.

    if (position < 0 || position > fActiveLimit) {
        status = U_INDEX_OUTOFBOUNDS_ERROR;
        return *this;
    }
    fMatchEnd = position;
    return *this;
}